

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O2

void __thiscall
hedg::MarketGenerator::MarketGenerator(MarketGenerator *this,int time_span,time_unit time_unit)

{
  (this->session_id_)._M_dataplus._M_p = (pointer)&(this->session_id_).field_2;
  (this->session_id_)._M_string_length = 0;
  (this->session_id_).field_2._M_local_buf[0] = '\0';
  this->time_span_ = time_span;
  this->time_unit_ = time_unit;
  std::condition_variable::condition_variable(&this->data_cond_);
  *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mut_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mut_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 8) = 0;
  (this->mut_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::
  queue<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>>
  ::
  queue<std::deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>,void>
            (&this->markets_);
  return;
}

Assistant:

MarketGenerator::MarketGenerator(int time_span, Timing::time_unit time_unit) : time_span_{ time_span }, time_unit_{ time_unit } {}